

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

void testing::internal::LogElementMatcherPairVec(ElementMatcherPairs *pairs,ostream *stream)

{
  ostream *poVar1;
  char *pcVar2;
  pointer ppVar3;
  
  std::operator<<(stream,"{");
  pcVar2 = "";
  for (ppVar3 = (pairs->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != (pairs->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    poVar1 = std::operator<<(stream,pcVar2);
    poVar1 = std::operator<<(poVar1,"\n  (");
    poVar1 = std::operator<<(poVar1,"element #");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,"matcher #");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,")");
    pcVar2 = ",";
  }
  std::operator<<(stream,"\n}");
  return;
}

Assistant:

static void LogElementMatcherPairVec(const ElementMatcherPairs& pairs,
                                     ::std::ostream* stream) {
  typedef ElementMatcherPairs::const_iterator Iter;
  ::std::ostream& os = *stream;
  os << "{";
  const char* sep = "";
  for (Iter it = pairs.begin(); it != pairs.end(); ++it) {
    os << sep << "\n  ("
       << "element #" << it->first << ", "
       << "matcher #" << it->second << ")";
    sep = ",";
  }
  os << "\n}";
}